

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int flagPragma(Parse *pParse,char *zLeft,char *zRight)

{
  sqlite3 *psVar1;
  u8 uVar2;
  int iVar3;
  Vdbe *p_00;
  uint local_4c;
  int mask;
  Vdbe *v;
  sqlite3 *db;
  sPragmaType *p;
  int i;
  char *zRight_local;
  char *zLeft_local;
  Parse *pParse_local;
  
  p._4_4_ = 0;
  db = (sqlite3 *)flagPragma::aPragma;
  while( true ) {
    if (0xd < p._4_4_) {
      return 0;
    }
    iVar3 = sqlite3_stricmp(zLeft,(char *)db->pVfs);
    if (iVar3 == 0) break;
    p._4_4_ = p._4_4_ + 1;
    db = (sqlite3 *)&db->pDfltColl;
  }
  psVar1 = pParse->db;
  p_00 = sqlite3GetVdbe(pParse);
  if (p_00 != (Vdbe *)0x0) {
    if (zRight == (char *)0x0) {
      returnSingleInt(pParse,(char *)db->pVfs,
                      (long)(int)(uint)((psVar1->flags & *(uint *)&db->pVdbe) != 0));
    }
    else {
      local_4c = *(uint *)&db->pVdbe;
      if (psVar1->autoCommit == '\0') {
        local_4c = local_4c & 0xfffbffff;
      }
      uVar2 = sqlite3GetBoolean(zRight,0);
      if (uVar2 == '\0') {
        psVar1->flags = (local_4c ^ 0xffffffff) & psVar1->flags;
      }
      else {
        psVar1->flags = local_4c | psVar1->flags;
      }
      sqlite3VdbeAddOp2(p_00,0x81,0,0);
    }
  }
  return 1;
}

Assistant:

static int flagPragma(Parse *pParse, const char *zLeft, const char *zRight){
  static const struct sPragmaType {
    const char *zName;  /* Name of the pragma */
    int mask;           /* Mask for the db->flags value */
  } aPragma[] = {
    { "full_column_names",        SQLITE_FullColNames  },
    { "short_column_names",       SQLITE_ShortColNames },
    { "count_changes",            SQLITE_CountRows     },
    { "empty_result_callbacks",   SQLITE_NullCallback  },
    { "legacy_file_format",       SQLITE_LegacyFileFmt },
    { "fullfsync",                SQLITE_FullFSync     },
    { "checkpoint_fullfsync",     SQLITE_CkptFullFSync },
    { "reverse_unordered_selects", SQLITE_ReverseOrder  },
#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
    { "automatic_index",          SQLITE_AutoIndex     },
#endif
#ifdef SQLITE_DEBUG
    { "sql_trace",                SQLITE_SqlTrace      },
    { "vdbe_listing",             SQLITE_VdbeListing   },
    { "vdbe_trace",               SQLITE_VdbeTrace     },
    { "vdbe_addoptrace",          SQLITE_VdbeAddopTrace},
    { "vdbe_debug",    SQLITE_SqlTrace | SQLITE_VdbeListing
                               | SQLITE_VdbeTrace      },
#endif
#ifndef SQLITE_OMIT_CHECK
    { "ignore_check_constraints", SQLITE_IgnoreChecks  },
#endif
    /* The following is VERY experimental */
    { "writable_schema",          SQLITE_WriteSchema|SQLITE_RecoveryMode },

    /* TODO: Maybe it shouldn't be possible to change the ReadUncommitted
    ** flag if there are any active statements. */
    { "read_uncommitted",         SQLITE_ReadUncommitted },
    { "recursive_triggers",       SQLITE_RecTriggers },

    /* This flag may only be set if both foreign-key and trigger support
    ** are present in the build.  */
#if !defined(SQLITE_OMIT_FOREIGN_KEY) && !defined(SQLITE_OMIT_TRIGGER)
    { "foreign_keys",             SQLITE_ForeignKeys },
#endif
  };
  int i;
  const struct sPragmaType *p;
  for(i=0, p=aPragma; i<ArraySize(aPragma); i++, p++){
    if( sqlite3StrICmp(zLeft, p->zName)==0 ){
      sqlite3 *db = pParse->db;
      Vdbe *v;
      v = sqlite3GetVdbe(pParse);
      assert( v!=0 );  /* Already allocated by sqlite3Pragma() */
      if( ALWAYS(v) ){
        if( zRight==0 ){
          returnSingleInt(pParse, p->zName, (db->flags & p->mask)!=0 );
        }else{
          int mask = p->mask;          /* Mask of bits to set or clear. */
          if( db->autoCommit==0 ){
            /* Foreign key support may not be enabled or disabled while not
            ** in auto-commit mode.  */
            mask &= ~(SQLITE_ForeignKeys);
          }

          if( sqlite3GetBoolean(zRight, 0) ){
            db->flags |= mask;
          }else{
            db->flags &= ~mask;
          }

          /* Many of the flag-pragmas modify the code generated by the SQL 
          ** compiler (eg. count_changes). So add an opcode to expire all
          ** compiled SQL statements after modifying a pragma value.
          */
          sqlite3VdbeAddOp2(v, OP_Expire, 0, 0);
        }
      }

      return 1;
    }
  }
  return 0;
}